

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleInline.hpp
# Opt level: O0

void __thiscall IMLE::clusterForwardSolutions(IMLE *this,int newSol1,int newSol2,int worseSol)

{
  reference pFVar1;
  Scalar *pSVar2;
  Scalar *pSVar3;
  reference piVar4;
  value_type *__x;
  vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  *this_00;
  reference this_01;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  ReturnType RVar5;
  double dVar6;
  Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>
  PVar7;
  int k_2;
  int j_1;
  ArrayX sumInvRxj;
  ArrayX sumInvRj;
  Scal pSum;
  X dist;
  int k_1;
  int j;
  int nIter;
  int k;
  Mat sol;
  Mat p;
  DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_>_>_>
  *in_stack_fffffffffffffa78;
  MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *in_stack_fffffffffffffa80;
  allocator_type *in_stack_fffffffffffffa88;
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *in_stack_fffffffffffffa90;
  MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
  *in_stack_fffffffffffffa98;
  MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *in_stack_fffffffffffffaa0;
  MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *in_stack_fffffffffffffaa8;
  DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
  *in_stack_fffffffffffffab0;
  double *in_stack_fffffffffffffad0;
  ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  *in_stack_fffffffffffffad8;
  int local_42c;
  int local_350;
  vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_348;
  vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_328;
  Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>
  local_310;
  Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>
  local_300;
  Scalar local_258;
  int local_10c;
  int local_108;
  int local_104;
  int local_58;
  int local_10;
  int local_c;
  
  local_10 = in_EDX;
  local_c = in_ESI;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffffaa0,
             (int *)in_stack_fffffffffffffa98,(int *)in_stack_fffffffffffffa90);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffffaa0,
             (int *)in_stack_fffffffffffffa98,(int *)in_stack_fffffffffffffa90);
  for (local_58 = 0; local_58 < *(int *)(in_RDI + 0x284) + -1; local_58 = local_58 + 1) {
    std::
    vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
    ::operator[]((vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  *)(in_RDI + 0x1d8),(long)local_58);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
              (in_stack_fffffffffffffa90,(Index)in_stack_fffffffffffffa88);
    Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>::operator=
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)
               in_stack_fffffffffffffa80,
               (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffffa78);
  }
  pFVar1 = std::vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>::
           operator[]((vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                       *)(in_RDI + 0xb0),(long)local_c);
  LinearExpert::getPredX(&pFVar1->super_LinearExpert);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
            (in_stack_fffffffffffffa90,(Index)in_stack_fffffffffffffa88);
  Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>::operator=
            ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)
             in_stack_fffffffffffffa80,
             (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffffa78);
  pFVar1 = std::vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>::
           operator[]((vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                       *)(in_RDI + 0xb0),(long)local_10);
  LinearExpert::getPredX(&pFVar1->super_LinearExpert);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
            (in_stack_fffffffffffffa90,(Index)in_stack_fffffffffffffa88);
  Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>::operator=
            ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)
             in_stack_fffffffffffffa80,
             (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffffa78);
  for (local_104 = 0; local_104 < *(int *)(in_RDI + 0x88); local_104 = local_104 + 1) {
    for (local_108 = 0; local_108 < *(int *)(in_RDI + 200); local_108 = local_108 + 1) {
      for (local_10c = 0; local_10c < *(int *)(in_RDI + 0x284); local_10c = local_10c + 1) {
        pFVar1 = std::
                 vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>::
                 operator[]((vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                             *)(in_RDI + 0xb0),(long)local_108);
        LinearExpert::getPredX(&pFVar1->super_LinearExpert);
        Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
                  (in_stack_fffffffffffffa90,(Index)in_stack_fffffffffffffa88);
        Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator-
                  (in_stack_fffffffffffffaa8,
                   (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
                    *)in_stack_fffffffffffffaa0);
        Eigen::Matrix<double,-1,1,0,-1,1>::
        Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>const>>
                  ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffa80,
                   (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
                    *)in_stack_fffffffffffffa78);
        Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
                  (in_stack_fffffffffffffa90,(Index)in_stack_fffffffffffffa88);
        Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>_>::
        asDiagonal((MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
                    *)in_stack_fffffffffffffa80);
        Eigen::
        DiagonalBase<Eigen::DiagonalWrapper<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>const>>
        ::operator*((DiagonalBase<Eigen::DiagonalWrapper<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
                     *)in_stack_fffffffffffffa90,
                    (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffffa88
                   );
        RVar5 = Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
                dot<Eigen::Product<Eigen::DiagonalWrapper<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>const>,Eigen::Matrix<double,_1,1,0,_1,1>,1>>
                          ((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                           in_stack_fffffffffffffa80,
                           (MatrixBase<Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>_>
                            *)in_stack_fffffffffffffa78);
        dVar6 = exp(RVar5 * -0.5);
        pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                            in_stack_fffffffffffffa80,(Index)in_stack_fffffffffffffa78,0x2fd6bf);
        *pSVar2 = dVar6;
        Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0x2fd6eb)
        ;
      }
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::row
                (in_stack_fffffffffffffa90,(Index)in_stack_fffffffffffffa88);
      local_258 = Eigen::
                  DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>::
                  sum((DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
                       *)in_stack_fffffffffffffa88);
      if (0.0 < local_258) {
        Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::row
                  (in_stack_fffffffffffffa90,(Index)in_stack_fffffffffffffa88);
        Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>::
        operator/=(in_stack_fffffffffffffab0,(Scalar *)in_stack_fffffffffffffaa8);
      }
    }
    PVar7 = Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                      (in_stack_fffffffffffffa80,
                       (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                       in_stack_fffffffffffffa78);
    local_300 = PVar7;
    PVar7 = Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                      (in_stack_fffffffffffffa80,
                       (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                       in_stack_fffffffffffffa78);
    local_310 = PVar7;
    Eigen::
    MatrixBase<Eigen::Product<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::Matrix<double,-1,-1,0,-1,-1>,0>>
    ::
    cwiseQuotient<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>>
              ((MatrixBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
                *)in_stack_fffffffffffffaa8,
               (MatrixBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
                *)in_stack_fffffffffffffaa0);
    Eigen::Matrix<double,-1,-1,0,-1,-1>::operator=
              ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffffa80,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>_>
                *)in_stack_fffffffffffffa78);
  }
  std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::allocator
            ((allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)0x2fd8f3);
  std::
  vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::vector((vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
            *)in_stack_fffffffffffffaa0,(size_type)in_stack_fffffffffffffa98,
           (value_type *)in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
  std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::~allocator
            ((allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)0x2fd927);
  std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::allocator
            ((allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)0x2fd95e);
  std::
  vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::vector((vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
            *)in_stack_fffffffffffffaa0,(size_type)in_stack_fffffffffffffa98,
           (value_type *)in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
  std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::~allocator
            ((allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)0x2fd98f);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffffa90,
             (Index)in_stack_fffffffffffffa88);
  for (local_350 = 0; local_350 < *(int *)(in_RDI + 200); local_350 = local_350 + 1) {
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::row
              (in_stack_fffffffffffffa90,(Index)in_stack_fffffffffffffa88);
    std::vector<int,_std::allocator<int>_>::operator[]
              ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x140),(long)local_350);
    Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>::
    maxCoeff<int>((DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
                   *)in_stack_fffffffffffffa80,(int *)in_stack_fffffffffffffa78);
    pFVar1 = std::vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
             ::operator[]((vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                           *)(in_RDI + 0xb0),(long)local_350);
    in_stack_fffffffffffffad8 =
         (ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> *)
         LinearExpert::get_p_z(&pFVar1->super_LinearExpert);
    in_stack_fffffffffffffad0 =
         (double *)
         std::vector<int,_std::allocator<int>_>::operator[]
                   ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x140),(long)local_350);
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                        in_stack_fffffffffffffa80,(Index)in_stack_fffffffffffffa78);
    *pSVar3 = *pSVar3 + (double)in_stack_fffffffffffffad8;
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
              (in_stack_fffffffffffffa90,(Index)in_stack_fffffffffffffa88);
    piVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x140),(long)local_350);
    std::
    vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
    ::operator[](&local_328,(long)*piVar4);
    Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator+=
              (in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
              (in_stack_fffffffffffffa90,(Index)in_stack_fffffffffffffa88);
    in_stack_fffffffffffffaa8 =
         (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
         std::vector<int,_std::allocator<int>_>::operator[]
                   ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x140),(long)local_350);
    in_stack_fffffffffffffaa0 =
         (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
         std::
         vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
         ::operator[](&local_348,(long)*(int *)in_stack_fffffffffffffaa8);
    Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator+=
              (in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98);
  }
  Eigen::MatrixBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::array
            ((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffffa78);
  Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,-1,1,0,-1,1>>>::operator+
            (in_stack_fffffffffffffad8,in_stack_fffffffffffffad0);
  Eigen::Matrix<double,-1,1,0,-1,1>::operator=
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffa80,in_stack_fffffffffffffa78)
  ;
  std::
  vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::clear((vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
           *)0x2fdcb0);
  for (local_42c = 0; local_42c < *(int *)(in_RDI + 0x284); local_42c = local_42c + 1) {
    __x = (value_type *)(in_RDI + 0x1d8);
    this_00 = (vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
               *)std::
                 vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
                 ::operator[](&local_348,(long)local_42c);
    this_01 = std::
              vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
              ::operator[](&local_328,(long)local_42c);
    Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
    cwiseQuotient<Eigen::Matrix<double,_1,1,0,_1,1>>
              (in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0);
    Eigen::Matrix<double,-1,1,0,-1,1>::
    Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
              (this_01,(EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                        *)in_stack_fffffffffffffa78);
    std::
    vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
    ::push_back(this_00,__x);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0x2fdd74);
  }
  std::
  vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::~vector((vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
             *)in_stack_fffffffffffffaa0);
  std::
  vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::~vector((vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
             *)in_stack_fffffffffffffaa0);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x2fddde);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x2fdded);
  return;
}

Assistant:

IMLE_CLASS_TEMPLATE
void IMLE_base::clusterForwardSolutions(int newSol1, int newSol2, int worseSol)
{
    Mat p(M,nSolFound);
    Mat sol(D,nSolFound);

    // "Educated" guesses for the nSolFound solutions
    for(int k = 0; k < nSolFound-1; k++)
        sol.col(k) = predictions[k];
    // Split worse solution in two
    sol.col(worseSol)    = experts[newSol1].getPredX();
    sol.col(nSolFound-1) = experts[newSol2].getPredX();

    for( int nIter = 0; nIter < param.iterMax; nIter++ )
    {
        // E-Step
        for( int j = 0; j < M; j++ )
        {
            for( int k = 0; k < nSolFound; k++ )
            {
                X dist = experts[j].getPredX() - sol.col(k);
                p(j,k) = exp(-0.5*dist.dot(fInvRj.col(j).asDiagonal()*dist));
            }
            Scal pSum;
            if( (pSum = p.row(j).sum()) > 0.0 )
                p.row(j) /= pSum;
        }
        // M-Step
        sol = (invRxj * p).cwiseQuotient( fInvRj * p );
        /* Here I can easily implement k-means by hard assigning to most probable solution */
    }


    /***** Recalculate (hard-assign) solutions   ******/
    // Aux variables
    ArrayX sumInvRj(nSolFound, zeroX);
    ArrayX sumInvRxj(nSolFound, zeroX);

    sum_p_z.setZero(nSolFound);

    // Hard assign solutions
    for( int j = 0; j < M; j++ )
    {
        p.row(j).maxCoeff(&sNearest[j]);

        sum_p_z(sNearest[j]) += experts[j].get_p_z();
        sumInvRj[sNearest[j]] += fInvRj.col(j);
        sumInvRxj[sNearest[j]] += invRxj.col(j);
    }
    sumW = sum_p_z.array() + pNoiseModelZ;

    // Clear predict data structure
    predictions.clear();

    // Update storage results
    for( int k = 0; k < nSolFound; k++ )
        predictions.push_back( sumInvRxj[k].cwiseQuotient(sumInvRj[k]) );
}